

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::sstring_view<char_const*>,void>
               (sstring_view<const_char_*> *container,ostream *os)

{
  char *pcVar1;
  size_type sVar2;
  size_type sVar3;
  
  std::operator<<(os,'{');
  pcVar1 = container->ptr_;
  sVar2 = container->size_;
  sVar3 = 0;
  do {
    if (sVar2 == sVar3) {
      if (sVar2 != 0) {
LAB_00163316:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((sVar3 != 0) && (std::operator<<(os,','), sVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00163316;
    }
    std::operator<<(os,' ');
    UniversalPrinter<char>::Print(pcVar1 + sVar3,os);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }